

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-rand.c
# Opt level: O2

_Bool randcalc_valid(random_value v,int test)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = false;
  iVar1 = randcalc(v,0,MINIMISE);
  if (iVar1 <= test) {
    iVar1 = randcalc(v,0,MAXIMISE);
    bVar2 = test <= iVar1;
  }
  return bVar2;
}

Assistant:

bool randcalc_valid(random_value v, int test)
{
	if (test < randcalc(v, 0, MINIMISE))
		return false;
	else if (test > randcalc(v, 0, MAXIMISE))
		return false;
	else
		return true;
}